

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

void __thiscall ot::commissioner::DtlsSession::HandleEvent(DtlsSession *this,short aFlags)

{
  char cVar1;
  ErrorCode EVar2;
  State SVar3;
  Error *pEVar4;
  char *from;
  char *to;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  allocator local_1a1;
  Error error;
  writer write;
  undefined1 local_158 [8];
  string local_150;
  format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pfStack_130;
  code *local_128;
  code *pcStack_120;
  code *local_118;
  string local_110;
  string local_f0;
  Error local_d0;
  undefined1 local_a8 [40];
  undefined1 local_80 [8];
  string local_78;
  undefined1 local_58 [8];
  string local_50;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  if ((this->mIsServer == true) && (this->mIsClientIdSet == false)) {
    SetClientTransportId((Error *)local_158,this);
    pEVar4 = Error::operator=(&error,(Error *)local_158);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)(local_158 + 8));
    if (EVar2 != kNone) goto LAB_0018e2fb;
  }
  if (this->mState == kConnected) {
LAB_0018e0dd:
    if (((aFlags & 2U) != 0) && (error.mCode == kNone)) {
      do {
        Read((Error *)local_158,this);
        Error::operator=(&error,(Error *)local_158);
        std::__cxx11::string::~string((string *)(local_158 + 8));
      } while (error.mCode == kNone);
    }
    if ((aFlags & 4U) == 0) goto LAB_0018e2fb;
    Error::Error((Error *)local_80,&error);
    if (((uint)local_80._0_4_ < kAlreadyExists) &&
       ((0x1201U >> (local_80._0_4_ & (kRejected|kInvalidState)) & 1) != 0)) {
      std::__cxx11::string::~string((string *)(local_80 + 8));
      TryWrite((Error *)local_158,this);
      Error::operator=(&error,(Error *)local_158);
      this_00 = (string *)(local_158 + 8);
    }
    else {
      this_00 = (string *)(local_80 + 8);
    }
  }
  else if (this->mState == kConnecting) {
    Handshake((Error *)local_158,this);
    Error::operator=(&error,(Error *)local_158);
    std::__cxx11::string::~string((string *)(local_158 + 8));
    Error::Error((Error *)local_58,&error);
    if (((uint)local_58._0_4_ < kAlreadyExists) &&
       ((0x1201U >> (local_58._0_4_ & (kRejected|kInvalidState)) & 1) != 0)) {
      SVar3 = this->mState;
      std::__cxx11::string::~string((string *)(local_58 + 8));
      if (SVar3 != kConnected) goto LAB_0018e2fb;
      goto LAB_0018e0dd;
    }
    this_00 = (string *)(local_58 + 8);
  }
  else {
    std::__cxx11::string::string((string *)&local_f0,"dtls",&local_1a1);
    local_158 = (undefined1  [8])0x10000000e;
    local_150._M_dataplus._M_p._0_4_ = string_type;
    local_150._M_string_length = 0x1fab98;
    local_150.field_2._M_allocated_capacity = 0x2c;
    local_150.field_2._8_8_ = 0x300000000;
    local_128 = ::fmt::v10::detail::
                parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
    pcStack_120 = ::fmt::v10::detail::
                  parse_format_specs<short,fmt::v10::detail::compile_parse_context<char>>;
    local_118 = ::fmt::v10::detail::
                parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    from = "session(={}) received event {:X} in state {}";
    write.handler_ =
         (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_158;
    pfStack_130 = (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_158;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,from,"");
          goto LAB_0018e261;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,short,std::__cxx11::string>&>
                       (to,"",(format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_158);
    }
LAB_0018e261:
    GetStateString_abi_cxx11_((string *)&write,this);
    local_150._M_string_length = (size_type)(uint)(int)aFlags;
    local_150.field_2._8_8_ = write.handler_;
    fmt.size_ = 0xd1e;
    fmt.data_ = (char *)0x2c;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_158;
    local_158 = (undefined1  [8])this;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_110,(v10 *)"session(={}) received event {:X} in state {}",fmt,args);
    Log(kDebug,&local_f0,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&write);
    this_00 = &local_f0;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0018e2fb:
  Error::Error((Error *)local_a8,&error);
  if (((uint)local_a8._0_4_ < kAlreadyExists) &&
     ((0x1201U >> (local_a8._0_4_ & (kRejected|kInvalidState)) & 1) != 0)) {
    pEVar4 = (Error *)local_a8;
  }
  else {
    std::__cxx11::string::~string((string *)(local_a8 + 8));
    Error::Error(&local_d0,&error);
    Disconnect(this,&local_d0);
    pEVar4 = &local_d0;
  }
  std::__cxx11::string::~string((string *)&pEVar4->mMessage);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void DtlsSession::HandleEvent(short aFlags)
{
    Error error;

    if (mIsServer && !mIsClientIdSet)
    {
        SuccessOrExit(error = SetClientTransportId());
    }

    switch (mState)
    {
    case State::kConnecting:
        error = Handshake();
        if (ShouldStop(error) || mState != State::kConnected)
        {
            break;
        }

        // Fall through

    case State::kConnected:
        if (aFlags & EV_READ)
        {
            while (error == ErrorCode::kNone)
            {
                error = Read();
            }
        }
        if ((aFlags & EV_WRITE) && !ShouldStop(error))
        {
            error = TryWrite();
        }
        break;

    default:
        // Ignore incoming data when the DTLS session is disconnected.

        LOG_DEBUG(LOG_REGION_DTLS, "session(={}) received event {:X} in state {}", static_cast<void *>(this), aFlags,
                  GetStateString());
        break;
    }

exit:
    if (ShouldStop(error))
    {
        Disconnect(error);
    }
}